

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O2

ASYNC_OPERATION_HANDLE
link_transfer_async(LINK_HANDLE link,message_format message_format,PAYLOAD *payloads,
                   size_t payload_count,ON_DELIVERY_SETTLED on_delivery_settled,
                   void *callback_context,LINK_TRANSFER_RESULT *link_transfer_error,
                   tickcounter_ms_t timeout)

{
  sender_settle_mode sVar1;
  int iVar2;
  SESSION_SEND_TRANSFER_RESULT SVar3;
  LOGGER_LOG p_Var4;
  ASYNC_OPERATION_HANDLE async_operation;
  TRANSFER_HANDLE transfer;
  AMQP_VALUE value;
  LIST_ITEM_HANDLE item;
  uchar auVar5 [4];
  char *pcVar6;
  code *on_send_complete;
  delivery_tag delivery_tag_value;
  uchar delivery_tag_bytes [4];
  
  if (link == (LINK_HANDLE)0x0 || link_transfer_error == (LINK_TRANSFER_RESULT *)0x0) {
    if (link_transfer_error != (LINK_TRANSFER_RESULT *)0x0) {
      *link_transfer_error = LINK_TRANSFER_ERROR;
    }
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (ASYNC_OPERATION_HANDLE)0x0;
    }
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c",
              "link_transfer_async",0x558,1,"Invalid arguments: link = %p, link_transfer_error = %p"
              ,link,link_transfer_error);
    return (ASYNC_OPERATION_HANDLE)0x0;
  }
  if (link->role == true) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                ,"link_transfer_async",0x55f,1,"Link is not a sender link");
    }
    *link_transfer_error = LINK_TRANSFER_ERROR;
    return (ASYNC_OPERATION_HANDLE)0x0;
  }
  if (link->link_state == LINK_STATE_ATTACHED) {
    if (link->current_link_credit == 0) {
      *link_transfer_error = LINK_TRANSFER_BUSY;
      return (ASYNC_OPERATION_HANDLE)0x0;
    }
    async_operation = async_operation_create(link_transfer_cancel_handler,0x38);
    if (async_operation != (ASYNC_OPERATION_HANDLE)0x0) {
      transfer = transfer_create(0);
      if (transfer == (TRANSFER_HANDLE)0x0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                    ,"link_transfer_async",0x57b,1,"Error creating transfer");
        }
        *link_transfer_error = LINK_TRANSFER_ERROR;
        async_operation_destroy(async_operation);
        return (ASYNC_OPERATION_HANDLE)0x0;
      }
      auVar5 = (uchar  [4])(link->delivery_count + 1);
      sVar1 = link->snd_settle_mode;
      delivery_tag_value._8_8_ = 4;
      delivery_tag_value.bytes = delivery_tag_bytes;
      delivery_tag_bytes = auVar5;
      iVar2 = transfer_set_delivery_tag(transfer,delivery_tag_value);
      if (iVar2 == 0) {
        iVar2 = transfer_set_message_format(transfer,message_format);
        if (iVar2 == 0) {
          iVar2 = transfer_set_settled(transfer,sVar1 != '\0');
          if (iVar2 == 0) {
            value = amqpvalue_create_transfer(transfer);
            if (value != (AMQP_VALUE)0x0) {
              iVar2 = tickcounter_get_current_ms
                                (link->tick_counter,(tickcounter_ms_t *)(async_operation + 5));
              if (iVar2 == 0) {
                async_operation[6].async_operation_cancel_handler =
                     (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)timeout;
                async_operation[2].async_operation_cancel_handler =
                     (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)on_delivery_settled;
                async_operation[3].async_operation_cancel_handler =
                     (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)callback_context;
                async_operation[4].async_operation_cancel_handler =
                     (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)link;
                item = singlylinkedlist_add(link->pending_deliveries,async_operation);
                if (item == (LIST_ITEM_HANDLE)0x0) {
                  p_Var4 = xlogging_get_log_function();
                  if (p_Var4 != (LOGGER_LOG)0x0) {
                    (*p_Var4)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                              ,"link_transfer_async",0x5d2,1,"Failed adding delivery to list");
                  }
                  *link_transfer_error = LINK_TRANSFER_ERROR;
                  goto LAB_00112254;
                }
                on_send_complete = (ON_SEND_COMPLETE)0x0;
                if (sVar1 != '\0') {
                  on_send_complete = ::on_send_complete;
                }
                SVar3 = session_send_transfer
                                  (link->link_endpoint,transfer,payloads,payload_count,
                                   (delivery_number *)(async_operation + 1),on_send_complete,item);
                if (SVar3 != SESSION_SEND_TRANSFER_OK) {
                  if (SVar3 == SESSION_SEND_TRANSFER_BUSY) {
                    p_Var4 = xlogging_get_log_function();
                    if (p_Var4 != (LOGGER_LOG)0x0) {
                      (*p_Var4)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                                ,"link_transfer_async",0x5ea,1,"Failed session send transfer");
                    }
                    iVar2 = singlylinkedlist_remove(link->pending_deliveries,item);
                    if (iVar2 == 0) {
                      async_operation_destroy(async_operation);
                    }
                    *link_transfer_error = LINK_TRANSFER_BUSY;
                  }
                  else {
                    p_Var4 = xlogging_get_log_function();
                    if (p_Var4 != (LOGGER_LOG)0x0) {
                      (*p_Var4)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                                ,"link_transfer_async",0x5de,1,"Failed session send transfer");
                    }
                    iVar2 = singlylinkedlist_remove(link->pending_deliveries,item);
                    if (iVar2 == 0) {
                      async_operation_destroy(async_operation);
                    }
                    *link_transfer_error = LINK_TRANSFER_ERROR;
                  }
                  goto LAB_00112259;
                }
                link->delivery_count = (sequence_no)auVar5;
                link->current_link_credit = link->current_link_credit - 1;
              }
              else {
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 != (LOGGER_LOG)0x0) {
                  (*p_Var4)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                            ,"link_transfer_async",0x5c2,1,"Failed getting current tick");
                }
                *link_transfer_error = LINK_TRANSFER_ERROR;
LAB_00112254:
                async_operation_destroy(async_operation);
LAB_00112259:
                async_operation = (ASYNC_OPERATION_HANDLE)0x0;
              }
              amqpvalue_destroy(value);
              goto LAB_001121d1;
            }
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              pcVar6 = "Failed creating transfer performative AMQP value";
              iVar2 = 0x5af;
              goto LAB_001121b4;
            }
          }
          else {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              pcVar6 = "Failed setting settled flag";
              iVar2 = 0x5a5;
              goto LAB_001121b4;
            }
          }
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            pcVar6 = "Failed setting message format";
            iVar2 = 0x59e;
            goto LAB_001121b4;
          }
        }
      }
      else {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          pcVar6 = "Failed setting delivery tag";
          iVar2 = 0x597;
LAB_001121b4:
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                    ,"link_transfer_async",iVar2,1,pcVar6);
        }
      }
      *link_transfer_error = LINK_TRANSFER_ERROR;
      async_operation_destroy(async_operation);
      async_operation = (ASYNC_OPERATION_HANDLE)0x0;
LAB_001121d1:
      transfer_destroy(transfer);
      return async_operation;
    }
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0011207d;
    pcVar6 = "Error creating async operation";
    iVar2 = 0x573;
  }
  else {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0011207d;
    pcVar6 = "Link is not attached";
    iVar2 = 0x565;
  }
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c",
            "link_transfer_async",iVar2,1,pcVar6);
LAB_0011207d:
  *link_transfer_error = LINK_TRANSFER_ERROR;
  return (ASYNC_OPERATION_HANDLE)0x0;
}

Assistant:

ASYNC_OPERATION_HANDLE link_transfer_async(LINK_HANDLE link, message_format message_format, PAYLOAD* payloads, size_t payload_count, ON_DELIVERY_SETTLED on_delivery_settled, void* callback_context, LINK_TRANSFER_RESULT* link_transfer_error, tickcounter_ms_t timeout)
{
    ASYNC_OPERATION_HANDLE result;

    if ((link == NULL) ||
        (link_transfer_error == NULL))
    {
        if (link_transfer_error != NULL)
        {
            *link_transfer_error = LINK_TRANSFER_ERROR;
        }

        LogError("Invalid arguments: link = %p, link_transfer_error = %p",
            link, link_transfer_error);
        result = NULL;
    }
    else
    {
        if (link->role != role_sender)
        {
            LogError("Link is not a sender link");
            *link_transfer_error = LINK_TRANSFER_ERROR;
            result = NULL;
        }
        else if (link->link_state != LINK_STATE_ATTACHED)
        {
            LogError("Link is not attached");
            *link_transfer_error = LINK_TRANSFER_ERROR;
            result = NULL;
        }
        else if (link->current_link_credit == 0)
        {
            *link_transfer_error = LINK_TRANSFER_BUSY;
            result = NULL;
        }
        else
        {
            result = CREATE_ASYNC_OPERATION(DELIVERY_INSTANCE, link_transfer_cancel_handler);
            if (result == NULL)
            {
                LogError("Error creating async operation");
                *link_transfer_error = LINK_TRANSFER_ERROR;
            }
            else
            {
                TRANSFER_HANDLE transfer = transfer_create(0);
                if (transfer == NULL)
                {
                    LogError("Error creating transfer");
                    *link_transfer_error = LINK_TRANSFER_ERROR;
                    async_operation_destroy(result);
                    result = NULL;
                }
                else
                {
                    sequence_no delivery_count = link->delivery_count + 1;
                    unsigned char delivery_tag_bytes[sizeof(delivery_count)];
                    delivery_tag delivery_tag;
                    bool settled;

                    (void)memcpy(delivery_tag_bytes, &delivery_count, sizeof(delivery_count));

                    delivery_tag.bytes = &delivery_tag_bytes;
                    delivery_tag.length = sizeof(delivery_tag_bytes);

                    if (link->snd_settle_mode == sender_settle_mode_unsettled)
                    {
                        settled = false;
                    }
                    else
                    {
                        settled = true;
                    }

                    if (transfer_set_delivery_tag(transfer, delivery_tag) != 0)
                    {
                        LogError("Failed setting delivery tag");
                        *link_transfer_error = LINK_TRANSFER_ERROR;
                        async_operation_destroy(result);
                        result = NULL;
                    }
                    else if (transfer_set_message_format(transfer, message_format) != 0)
                    {
                        LogError("Failed setting message format");
                        *link_transfer_error = LINK_TRANSFER_ERROR;
                        async_operation_destroy(result);
                        result = NULL;
                    }
                    else if (transfer_set_settled(transfer, settled) != 0)
                    {
                        LogError("Failed setting settled flag");
                        *link_transfer_error = LINK_TRANSFER_ERROR;
                        async_operation_destroy(result);
                        result = NULL;
                    }
                    else
                    {
                        AMQP_VALUE transfer_value = amqpvalue_create_transfer(transfer);
                        if (transfer_value == NULL)
                        {
                            LogError("Failed creating transfer performative AMQP value");
                            *link_transfer_error = LINK_TRANSFER_ERROR;
                            async_operation_destroy(result);
                            result = NULL;
                        }
                        else
                        {
                            DELIVERY_INSTANCE* pending_delivery = GET_ASYNC_OPERATION_CONTEXT(DELIVERY_INSTANCE, result);
                            if (pending_delivery == NULL)
                            {
                                LogError("Failed getting pending delivery");
                                *link_transfer_error = LINK_TRANSFER_ERROR;
                                async_operation_destroy(result);
                                result = NULL;
                            }
                            else
                            {
                                if (tickcounter_get_current_ms(link->tick_counter, &pending_delivery->start_tick) != 0)
                                {
                                    LogError("Failed getting current tick");
                                    *link_transfer_error = LINK_TRANSFER_ERROR;
                                    async_operation_destroy(result);
                                    result = NULL;
                                }
                                else
                                {
                                    LIST_ITEM_HANDLE delivery_instance_list_item;
                                    pending_delivery->timeout = timeout;
                                    pending_delivery->on_delivery_settled = on_delivery_settled;
                                    pending_delivery->callback_context = callback_context;
                                    pending_delivery->link = link;
                                    delivery_instance_list_item = singlylinkedlist_add(link->pending_deliveries, result);

                                    if (delivery_instance_list_item == NULL)
                                    {
                                        LogError("Failed adding delivery to list");
                                        *link_transfer_error = LINK_TRANSFER_ERROR;
                                        async_operation_destroy(result);
                                        result = NULL;
                                    }
                                    else
                                    {
                                        /* here we should feed data to the transfer frame */
                                        switch (session_send_transfer(link->link_endpoint, transfer, payloads, payload_count, &pending_delivery->delivery_id, (settled) ? on_send_complete : NULL, delivery_instance_list_item))
                                        {
                                        default:
                                        case SESSION_SEND_TRANSFER_ERROR:
                                            LogError("Failed session send transfer");
                                            if (singlylinkedlist_remove(link->pending_deliveries, delivery_instance_list_item) == 0)
                                            {
                                                async_operation_destroy(result);
                                            }

                                            *link_transfer_error = LINK_TRANSFER_ERROR;
                                            result = NULL;
                                            break;

                                        case SESSION_SEND_TRANSFER_BUSY:
                                            /* Ensure we remove from list again since sender will attempt to transfer again on flow on */
                                            LogError("Failed session send transfer");
                                            if (singlylinkedlist_remove(link->pending_deliveries, delivery_instance_list_item) == 0)
                                            {
                                                async_operation_destroy(result);
                                            }

                                            *link_transfer_error = LINK_TRANSFER_BUSY;
                                            result = NULL;
                                            break;

                                        case SESSION_SEND_TRANSFER_OK:
                                            link->delivery_count = delivery_count;
                                            link->current_link_credit--;
                                            break;
                                        }
                                    }
                                }
                            }

                            amqpvalue_destroy(transfer_value);
                        }
                    }

                    transfer_destroy(transfer);
                }
            }
        }
    }

    return result;
}